

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O1

void __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::FlushBackgroundPages
          (PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
           *this)

{
  size_t *psVar1;
  uint pageCount;
  undefined4 *puVar2;
  PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *segment;
  HANDLE pVVar3;
  code *pcVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  DWORD DVar8;
  FreePageEntry *address;
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
  *fromSegmentList;
  HANDLE pVVar9;
  ThreadContextId pvVar10;
  ulong uVar11;
  undefined8 *in_FS_OFFSET;
  
  iVar6 = (*this->_vptr_PageAllocatorBase[3])();
  if ((char)iVar6 != '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x732,"(!this->HasMultiThreadAccess())","!this->HasMultiThreadAccess()");
    if (!bVar5) goto LAB_0025cd84;
    *puVar2 = 0;
  }
  if (this->backgroundPageQueue == (BackgroundPageQueue *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x733,"(backgroundPageQueue)","backgroundPageQueue");
    if (!bVar5) {
LAB_0025cd84:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar2 = 0;
  }
  puVar2 = (undefined4 *)*in_FS_OFFSET;
  uVar7 = 0;
  do {
    address = BackgroundPageQueue::PopFreePageEntry(this->backgroundPageQueue);
    if (address != (FreePageEntry *)0x0) {
      segment = address->segment;
      pageCount = address->pageCount;
      fromSegmentList = GetSegmentList(this,segment);
      if (fromSegmentList ==
          (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)
          0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar2 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                           ,0x745,"(fromSegmentList != nullptr)","fromSegmentList != nullptr");
        if (!bVar5) goto LAB_0025cd84;
        *puVar2 = 0;
      }
      pVVar3 = this->processHandle;
      pVVar9 = GetCurrentProcess();
      if (pVVar3 != pVVar9) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar2 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                           ,0x747,"(this->processHandle == GetCurrentProcess())",
                           "this->processHandle == GetCurrentProcess()");
        if (!bVar5) goto LAB_0025cd84;
        *puVar2 = 0;
      }
      address->Next = (FreePageEntry *)0x0;
      address->segment = (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *)0x0;
      *(undefined8 *)&address->pageCount = 0;
      PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::ReleasePages
                (segment,address,pageCount);
      uVar7 = uVar7 + pageCount;
      TransferSegment(this,segment,fromSegmentList);
    }
    if (address == (FreePageEntry *)0x0) {
      uVar11 = (ulong)uVar7;
      SubUsedBytes(this,uVar11 << 0xc);
      if (this->memoryData != (PageMemoryData *)0x0) {
        psVar1 = &this->memoryData->releasePageCount;
        *psVar1 = *psVar1 + uVar11;
      }
      bVar5 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Trace,PageAllocatorPhase);
      if ((bVar5) && (this->pageAllocatorFlagTable->Verbose == true)) {
        pvVar10 = JsUtil::ExternalApi::GetCurrentThreadContextId();
        DVar8 = GetCurrentThreadId();
        Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar10,(ulong)DVar8,this);
        if (this->debugName != (char16 *)0x0) {
          Output::Print(L"[%s] ");
        }
        Output::Print(L"New free pages: %d\n",(ulong)uVar7);
        Output::Print(L"\n");
        Output::Flush();
      }
      UpdateMinFreePageCount(this);
      this->freePageCount = this->freePageCount + uVar11;
      return;
    }
  } while( true );
}

Assistant:

void
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::FlushBackgroundPages()
{
    Assert(!this->HasMultiThreadAccess());
    Assert(backgroundPageQueue);

    // We can have additional pages queued up to be zeroed out here
    // and that's okay since they'll eventually be zeroed out before being flushed

    uint newFreePages = 0;

    while (true)
    {
        FreePageEntry * freePageEntry = backgroundPageQueue->PopFreePageEntry();
        if (freePageEntry == nullptr)
        {
            break;
        }
        TPageSegment * segment = freePageEntry->segment;
        uint pageCount = freePageEntry->pageCount;

        DListBase<TPageSegment> * fromSegmentList = GetSegmentList(segment);
        Assert(fromSegmentList != nullptr);

        Assert(this->processHandle == GetCurrentProcess());
        memset(freePageEntry, 0, sizeof(FreePageEntry));

        segment->ReleasePages(freePageEntry, pageCount);
        newFreePages += pageCount;

        TransferSegment(segment, fromSegmentList);
    }

    LogFreePages(newFreePages);

    PAGE_ALLOC_VERBOSE_TRACE(_u("New free pages: %d\n"), newFreePages);
    this->AddFreePageCount(newFreePages);
}